

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O1

void __thiscall
PlanningUnitMADPDiscrete::GetObservationHistoryArrays
          (PlanningUnitMADPDiscrete *this,Index agentI,Index ohI,Index t,Index *oIs)

{
  pointer pvVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Index IVar5;
  undefined8 uVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar13 [64];
  undefined1 in_XMM2 [16];
  undefined1 auVar12 [64];
  undefined1 extraout_var_00 [56];
  
  uVar7 = (ulong)agentI;
  pvVar1 = (this->_m_firstOHIforT).
           super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar8 = ((long)(this->_m_firstOHIforT).
                 super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  uVar10 = uVar7;
  if (uVar7 <= uVar8 && uVar8 - uVar7 != 0) {
    uVar10 = (ulong)t;
    lVar2 = *(long *)&pvVar1[uVar7].
                      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                      _M_impl.super__Vector_impl_data;
    if (uVar10 < (ulong)((long)*(pointer *)
                                ((long)&pvVar1[uVar7].
                                        super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                        ._M_impl.super__Vector_impl_data + 8) - lVar2 >> 3)) {
      IVar5 = Globals::CastLIndexToIndex(*(LIndex *)(lVar2 + uVar10 * 8));
      uVar6 = (**(code **)((long)*this->_m_madp + 0xc0))(this->_m_madp,agentI);
      auVar12._8_56_ = extraout_var;
      auVar12._0_8_ = extraout_XMM0_Qa;
      if (t != 0) {
        uVar11 = ohI - IVar5;
        auVar4 = vcvtusi2sd_avx512f(auVar12._0_16_,uVar6);
        iVar9 = t - 1;
        uVar8 = 0;
        do {
          auVar3 = vcvtusi2sd_avx512f(in_XMM2,iVar9);
          auVar13._0_8_ = pow(auVar4._0_8_,auVar3._0_8_);
          auVar13._8_56_ = extraout_var_00;
          uVar7 = vcvttsd2usi_avx512f(auVar13._0_16_);
          IVar5 = (Index)(uVar11 / uVar7);
          oIs[uVar8] = IVar5;
          uVar11 = uVar11 - (int)uVar7 * IVar5;
          uVar8 = uVar8 + 1;
          iVar9 = iVar9 + -1;
        } while (uVar10 != uVar8);
      }
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar10);
}

Assistant:

void 
PlanningUnitMADPDiscrete::GetObservationHistoryArrays
    (Index agentI, Index ohI, Index t,  Index oIs[]) const
{
    //substract the offset to find out what is the index within the time-step-t-
    //observation-histories.
    Index ohIwithinThisT = ohI - CastLIndexToIndex(_m_firstOHIforT.at(agentI).at(t));
   
    Index remainder = ohIwithinThisT;
    size_t vec_size = t; // the number of joint observations we are searching
    size_t nrO = GetNrObservations(agentI);
    //size_t nrJA = GetNrJointActions();
    for(Index t2=0; t2 < vec_size ; t2++)
    {
        // for explanation see GetJointActionObservationHistoryArrays()
        //
        // we start with stage
        size_t stage = (t-1) - t2;
        //we are going to calculate the joa that took place at time stage
        size_t b = (size_t) pow((double)nrO, (double)(stage));
        Index oI_t2 = remainder / b;
        oIs[t2] = oI_t2; 
        remainder -= oI_t2 * b;
    }
}